

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall VM::exec(VM *this)

{
  uchar **__args;
  pointer *pppuVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  pointer ppSVar6;
  FunctionInformation *pFVar7;
  StackFrame *pSVar8;
  pointer ppuVar9;
  iterator __position;
  StackFrame **arguments;
  size_t sVar10;
  uchar **out;
  bool bVar11;
  size_t sVar12;
  int offset;
  size_t sz;
  uchar *local_50;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *local_48;
  uchar **local_40;
  size_t local_38;
  
  __args = &this->cip;
  local_40 = &this->rsp;
  local_48 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)&this->retstack;
  out = local_40;
LAB_00104527:
  puVar5 = *__args;
  uVar2 = *puVar5;
  *__args = puVar5 + 1;
  switch(uVar2) {
  case '\0':
    iVar3 = *(int *)(puVar5 + 1);
    this->cip = puVar5 + 5;
    push(this,puVar5 + 5,(long)iVar3);
    this->cip = this->cip + iVar3;
    goto LAB_00104527;
  case '\x01':
    break;
  case '\x02':
    pop<unsigned_long>(this,&local_38);
    pop<void*>(this,&local_50);
    push(this,local_50,local_38);
    goto LAB_00104527;
  case '\x03':
    ppSVar6 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pSVar8 = ppSVar6[-2];
    memcpy(*(void **)ppSVar6[-1]->ptr,pSVar8->ptr,pSVar8->size);
    pop(this);
    break;
  case '\x04':
    pop<int>(this,(int *)&local_50);
    pSVar8 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1];
    sVar12 = pSVar8->size;
    if (sVar12 != 0) {
      bVar11 = false;
      sVar10 = 0;
      do {
        if (pSVar8->ptr[sVar10] != '\0') {
          bVar11 = true;
        }
        sVar10 = sVar10 + 1;
      } while (sVar12 != sVar10);
      pop(this);
      if (bVar11) {
        this->cip = this->firmware + (int)local_50;
      }
      goto LAB_00104527;
    }
    break;
  case '\x05':
    iVar3 = *(int *)(puVar5 + 1);
    this->cip = puVar5 + 5;
    pFVar7 = this->imports;
    if (pFVar7[iVar3].isExternal == true) {
      iVar4 = pFVar7[iVar3].argcount;
      sVar10 = (size_t)iVar4;
      arguments = (StackFrame **)operator_new__(-(ulong)(sVar10 + 1 >> 0x3d != 0) | sVar10 * 8 + 8);
      sVar12 = sVar10;
      if (iVar4 != 0) {
        do {
          arguments[sVar12 - 1] =
               (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl
               .super__Vector_impl_data._M_finish[-1];
          rmstack(this);
          sVar12 = sVar12 - 1;
        } while (sVar12 != 0);
      }
      platform_call_wrapper
                (pFVar7[iVar3].ptr,arguments,sVar10,(long)pFVar7[iVar3].outsize,
                 pFVar7[iVar3].isVarArgs,this);
      if (iVar4 != 0) {
        sVar12 = 0;
        do {
          pSVar8 = arguments[sVar12];
          if (pSVar8 != (StackFrame *)0x0) {
            if (pSVar8->ptr != (uchar *)0x0) {
              operator_delete__(pSVar8->ptr);
            }
            operator_delete(pSVar8);
          }
          sVar12 = sVar12 + 1;
        } while (sVar10 != sVar12);
      }
      operator_delete__(arguments);
      out = local_40;
    }
    else {
      __position._M_current =
           (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(local_48,__position,__args);
      }
      else {
        *__position._M_current = puVar5 + 5;
        pppuVar1 = &(this->retstack).
                    super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppuVar1 = *pppuVar1 + 1;
      }
      this->cip = this->programBase + pFVar7[iVar3].offset;
    }
    goto LAB_00104527;
  case '\x06':
    ppuVar9 = (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppuVar9 ==
        (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      return;
    }
    this->cip = ppuVar9[-1];
    (this->retstack).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppuVar9 + -1;
    goto LAB_00104527;
  case '\a':
    pop<unsigned_char*>(this,out);
    goto LAB_00104527;
  case '\b':
    push(this,out,8);
    goto LAB_00104527;
  case '\t':
    goto switchD_00104546_caseD_9;
  default:
    puts("Illegal instruction");
    abort();
  }
  pop(this);
  goto LAB_00104527;
switchD_00104546_caseD_9:
  local_50 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl.
             super__Vector_impl_data._M_finish[-1]->ptr;
  push(this,&local_50,8);
  ppSVar6 = (this->stack).super__Vector_base<StackFrame_*,_std::allocator<StackFrame_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppSVar6[-1]->vref = ppSVar6[-2];
  goto LAB_00104527;
}

Assistant:

void exec() {
    while(1) {
    unsigned char opcode;
    unsigned char* oldip = cip;
    read(opcode);
    switch(opcode) {
    case 0:
    {
      //PUSH constant
      int len;
      read(len);
      push(cip,len);
      cip+=len;
    }
      break;
    case 1:
    {
      //POP
      pop();
    }
      break;
    case 2:
    {
      //Load
      void* addr;
      size_t sz;
      pop(sz);
      pop(addr);
      push(addr,sz);
    }
      break;
    case 3:
    {
      //Store
      StackFrame* val = stack[stack.size()-2];
      StackFrame* addr_val = stack[stack.size()-1];
      void* addr;
      memcpy(&addr,addr_val->ptr,sizeof(void*));
      memcpy(addr,val->ptr,val->size);
      pop();
      pop();
    }
      break;
    case 4:
    {
      //Absolute branch
      int offset;
      pop(offset);
      bool shouldBranch = false;
      
      StackFrame* frame = stack.back();
      for(size_t i = 0;i<frame->size;i++) {
	if(frame->ptr[i]) {
	  shouldBranch = true;
	}
      }
      
      pop();
      if(shouldBranch) {
	cip =firmware+offset;
      }
    }
      break;
    case 5:
    {
      //Procedure call
      int funcid;
      read(funcid);
      FunctionInformation* info = imports+funcid;
      size_t argcount = info->argcount;
      if(info->isExternal) {
      StackFrame** args = new StackFrame*[argcount+1];
      for(size_t i = 0;i<argcount;i++) {
	args[argcount-i-1] = stack.back();
	rmstack();
      }
      
      platform_call_wrapper(info->ptr,args,argcount,info->outsize,info->isVarArgs,this);
      for(size_t i = 0;i<argcount;i++) {
	delete args[i];
      }
      delete[] args;
      }else {
	retstack.push_back(cip);
	cip = programBase+info->offset;
      }
    }
      break;
    case 6:
    {
      //Procedure call return/exit
      if(!retstack.size()) {
	return;
      }
      cip = retstack.back();
      retstack.pop_back();
    }
      break;
    case 7:
    {
      //Set stack pointer
      pop(rsp);
    }
      break;
    case 8:
    {
      //Read stack pointer
      push(&rsp,sizeof(rsp));
    }
      break;
    case 9:
    {
      //This pointer (reference)
      void* addr = stack.back()->ptr;
      push(&addr,sizeof(addr));
      stack.back()->vref = stack[stack.size()-2];
    }
      break;
    default:
    {
      printf("Illegal instruction\n");
      abort();
    }
      break;
  }
    }
  }